

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O1

void Qentem::Test::TestIfUTag2(QTest *test)

{
  char16_t *pcVar1;
  Value<char16_t> *this;
  Array<Qentem::Tags::TagBit> tags_cache;
  StringStream<char16_t> ss;
  Value<char16_t> value;
  Array<Qentem::Tags::TagBit> local_88;
  StringStream<char16_t> local_78;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_68;
  undefined1 local_58;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> local_48;
  
  local_78.storage_ = (char16_t *)0x0;
  local_78.length_ = 0;
  local_78.capacity_ = 0;
  local_68.array_.storage_ = (Value<char16_t> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_68.array_);
  local_58 = 2;
  this = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                   ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_68.array_,
                    L"name",4);
  Value<char16_t>::operator=(this,L"Qentem");
  local_88.storage_ = (TagBit *)0x0;
  local_88.index_ = 0;
  local_88.capacity_ = 0;
  local_48.value_ = (Value<char16_t> *)0x0;
  local_48.stream_ = (StringStream<char16_t> *)0x0;
  local_48.loops_items_ =
       (Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
        *)0x0;
  local_48.content_ = L"<if case=\"1\">{var:name}";
  local_48.length_ = 0x17;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<if case=\"1\">{var:name}",0x17,&local_88);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            (&local_48,&local_88,(Value<char16_t> *)&local_68.array_,&local_78);
  Array<Qentem::Tags::TagBit>::~Array(&local_88);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[24]>
            (test,&local_78,(char16_t (*) [24])L"<if case=\"1\">{var:name}",0xdb6);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_88.storage_ = (TagBit *)0x0;
  local_88.index_ = 0;
  local_88.capacity_ = 0;
  local_48.value_ = (Value<char16_t> *)0x0;
  local_48.stream_ = (StringStream<char16_t> *)0x0;
  local_48.loops_items_ =
       (Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
        *)0x0;
  local_48.content_ = L"<if<if case=\"1\">{var:name}</if>";
  local_48.length_ = 0x1f;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<if<if case=\"1\">{var:name}</if>",0x1f,&local_88);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            (&local_48,&local_88,(Value<char16_t> *)&local_68.array_,&local_78);
  Array<Qentem::Tags::TagBit>::~Array(&local_88);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[32]>
            (test,&local_78,(char16_t (*) [32])L"<if<if case=\"1\">{var:name}</if>",0xdba);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_88.storage_ = (TagBit *)0x0;
  local_88.index_ = 0;
  local_88.capacity_ = 0;
  local_48.value_ = (Value<char16_t> *)0x0;
  local_48.stream_ = (StringStream<char16_t> *)0x0;
  local_48.loops_items_ =
       (Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
        *)0x0;
  local_48.content_ = L"<if case=\"1\"><if case=\"1\">{var:name}</if>";
  local_48.length_ = 0x29;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<if case=\"1\"><if case=\"1\">{var:name}</if>",0x29,&local_88);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            (&local_48,&local_88,(Value<char16_t> *)&local_68.array_,&local_78);
  Array<Qentem::Tags::TagBit>::~Array(&local_88);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[42]>
            (test,&local_78,(char16_t (*) [42])L"<if case=\"1\"><if case=\"1\">{var:name}</if>",
             0xdbe);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_88.storage_ = (TagBit *)0x0;
  local_88.index_ = 0;
  local_88.capacity_ = 0;
  local_48.value_ = (Value<char16_t> *)0x0;
  local_48.stream_ = (StringStream<char16_t> *)0x0;
  local_48.loops_items_ =
       (Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
        *)0x0;
  local_48.content_ = L"<if case=\"1\"><if case=\"1\"><if case=\"1\">{var:name}</if></if>";
  local_48.length_ = 0x3b;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<if case=\"1\"><if case=\"1\"><if case=\"1\">{var:name}</if></if>",0x3b,&local_88);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            (&local_48,&local_88,(Value<char16_t> *)&local_68.array_,&local_78);
  Array<Qentem::Tags::TagBit>::~Array(&local_88);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[60]>
            (test,&local_78,
             (char16_t (*) [60])L"<if case=\"1\"><if case=\"1\"><if case=\"1\">{var:name}</if></if>"
             ,0xdc3);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_88.storage_ = (TagBit *)0x0;
  local_88.index_ = 0;
  local_88.capacity_ = 0;
  local_48.value_ = (Value<char16_t> *)0x0;
  local_48.stream_ = (StringStream<char16_t> *)0x0;
  local_48.loops_items_ =
       (Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
        *)0x0;
  local_48.content_ = L"<if case=\"ABC\">{var:name}</if>";
  local_48.length_ = 0x1e;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<if case=\"ABC\">{var:name}</if>",0x1e,&local_88);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            (&local_48,&local_88,(Value<char16_t> *)&local_68.array_,&local_78);
  Array<Qentem::Tags::TagBit>::~Array(&local_88);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[1]>
            (test,&local_78,(char16_t (*) [1])0x142a46,0xdc7);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_88.storage_ = (TagBit *)0x0;
  local_88.index_ = 0;
  local_88.capacity_ = 0;
  local_48.value_ = (Value<char16_t> *)0x0;
  local_48.stream_ = (StringStream<char16_t> *)0x0;
  local_48.loops_items_ =
       (Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
        *)0x0;
  local_48.content_ = L"<if>{var:name}</if>";
  local_48.length_ = 0x13;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<if>{var:name}</if>",0x13,&local_88);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            (&local_48,&local_88,(Value<char16_t> *)&local_68.array_,&local_78);
  Array<Qentem::Tags::TagBit>::~Array(&local_88);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[1]>
            (test,&local_78,(char16_t (*) [1])0x142a46,0xdcb);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_88.storage_ = (TagBit *)0x0;
  local_88.index_ = 0;
  local_88.capacity_ = 0;
  local_48.value_ = (Value<char16_t> *)0x0;
  local_48.stream_ = (StringStream<char16_t> *)0x0;
  local_48.loops_items_ =
       (Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
        *)0x0;
  local_48.content_ = L"<if case=\"0\"><elseif />{var:name}</if>";
  local_48.length_ = 0x26;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<if case=\"0\"><elseif />{var:name}</if>",0x26,&local_88);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            (&local_48,&local_88,(Value<char16_t> *)&local_68.array_,&local_78);
  Array<Qentem::Tags::TagBit>::~Array(&local_88);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[39]>
            (test,&local_78,(char16_t (*) [39])L"<if case=\"0\"><elseif />{var:name}</if>",0xdcf);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_88.storage_ = (TagBit *)0x0;
  local_88.index_ = 0;
  local_88.capacity_ = 0;
  local_48.value_ = (Value<char16_t> *)0x0;
  local_48.stream_ = (StringStream<char16_t> *)0x0;
  local_48.loops_items_ =
       (Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
        *)0x0;
  local_48.content_ = L"<iw case=\"0\">{var:name}</if>";
  local_48.length_ = 0x1c;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<iw case=\"0\">{var:name}</if>",0x1c,&local_88);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            (&local_48,&local_88,(Value<char16_t> *)&local_68.array_,&local_78);
  Array<Qentem::Tags::TagBit>::~Array(&local_88);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[25]>
            (test,&local_78,(char16_t (*) [25])L"<iw case=\"0\">Qentem</if>",0xdd3);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_88.storage_ = (TagBit *)0x0;
  local_88.index_ = 0;
  local_88.capacity_ = 0;
  local_48.value_ = (Value<char16_t> *)0x0;
  local_48.stream_ = (StringStream<char16_t> *)0x0;
  local_48.loops_items_ =
       (Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
        *)0x0;
  local_48.content_ = L"<if case=\"0\"{var:name}</if>";
  local_48.length_ = 0x1b;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<if case=\"0\"{var:name}</if>",0x1b,&local_88);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            (&local_48,&local_88,(Value<char16_t> *)&local_68.array_,&local_78);
  Array<Qentem::Tags::TagBit>::~Array(&local_88);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[28]>
            (test,&local_78,(char16_t (*) [28])L"<if case=\"0\"{var:name}</if>",0xdd7);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_88.storage_ = (TagBit *)0x0;
  local_88.index_ = 0;
  local_88.capacity_ = 0;
  local_48.value_ = (Value<char16_t> *)0x0;
  local_48.stream_ = (StringStream<char16_t> *)0x0;
  local_48.loops_items_ =
       (Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
        *)0x0;
  local_48.content_ = L"<if case=\"0\"><else {var:name}</if>";
  local_48.length_ = 0x22;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<if case=\"0\"><else {var:name}</if>",0x22,&local_88);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            (&local_48,&local_88,(Value<char16_t> *)&local_68.array_,&local_78);
  Array<Qentem::Tags::TagBit>::~Array(&local_88);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[35]>
            (test,&local_78,(char16_t (*) [35])L"<if case=\"0\"><else {var:name}</if>",0xddb);
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  Value<char16_t>::~Value((Value<char16_t> *)&local_68.array_);
  pcVar1 = local_78.storage_;
  if (local_78.storage_ != (char16_t *)0x0) {
    MemoryRecord::RemoveAllocation(local_78.storage_);
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

static void TestIfUTag2(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;
    const char16_t        *content;

    value[uR"(name)"] = uR"(Qentem)";

    content = uR"(<if case="1">{var:name})";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="1">{var:name})", __LINE__);
    ss.Clear();

    content = uR"(<if<if case="1">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if<if case="1">{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="1"><if case="1">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="1"><if case="1">{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="1"><if case="1"><if case="1">{var:name}</if></if>)";
    test.IsEqual(Template::Render(content, value, ss),
                 uR"(<if case="1"><if case="1"><if case="1">{var:name}</if></if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="ABC">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"()", __LINE__);
    ss.Clear();

    content = uR"(<if>{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"()", __LINE__);
    ss.Clear();

    content = uR"(<if case="0"><elseif />{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="0"><elseif />{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<iw case="0">{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<iw case="0">Qentem</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="0"{var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="0"{var:name}</if>)", __LINE__);
    ss.Clear();

    content = uR"(<if case="0"><else {var:name}</if>)";
    test.IsEqual(Template::Render(content, value, ss), uR"(<if case="0"><else {var:name}</if>)", __LINE__);
    ss.Clear();
}